

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::SignEcdsaAdaptor(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::SignEcdsaAdaptorResponseStruct_(const_cfd::js::api::SignEcdsaAdaptorRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::SignEcdsaAdaptorResponseStruct(cfd::js::api::SignEcdsaAdaptorRequestStruct_const&)>
  ::
  function<cfd::js::api::SignEcdsaAdaptorResponseStruct(&)(cfd::js::api::SignEcdsaAdaptorRequestStruct_const&),void>
            ((function<cfd::js::api::SignEcdsaAdaptorResponseStruct(cfd::js::api::SignEcdsaAdaptorRequestStruct_const&)>
              *)&local_38,SchnorrApi::SignEcdsaAdaptor);
  ExecuteJsonApi<cfd::js::api::json::SignEcdsaAdaptorRequest,cfd::js::api::json::SignEcdsaAdaptorResponse,cfd::js::api::SignEcdsaAdaptorRequestStruct,cfd::js::api::SignEcdsaAdaptorResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::SignEcdsaAdaptorResponseStruct_(const_cfd::js::api::SignEcdsaAdaptorRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::SignEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      SignEcdsaAdaptorRequest, SignEcdsaAdaptorResponse,
      SignEcdsaAdaptorRequestStruct, SignEcdsaAdaptorResponseStruct>(
      request_message, SchnorrApi::SignEcdsaAdaptor);
}